

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__copyval(int channel,stbi_uc *dest,stbi_uc *src)

{
  int local_28;
  uint local_24;
  int i;
  int mask;
  stbi_uc *src_local;
  stbi_uc *dest_local;
  int channel_local;
  
  local_24 = 0x80;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    if ((channel & local_24) != 0) {
      dest[local_28] = src[local_28];
    }
    local_24 = (int)local_24 >> 1;
  }
  return;
}

Assistant:

static void stbi__copyval(int channel,stbi_uc *dest,const stbi_uc *src)
{
   int mask=0x80,i;

   for (i=0;i<4; ++i, mask>>=1)
      if (channel&mask)
         dest[i]=src[i];
}